

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void google::protobuf::internal::PackedFieldHelper<1>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  double *pdVar1;
  double *pdVar2;
  int i;
  int index;
  RepeatedField<double> *array;
  
  if (*field != 0) {
    WriteTagTo<google::protobuf::internal::ArrayOutput>(md->tag,output);
    WriteLengthTo<google::protobuf::internal::ArrayOutput>(*(uint32_t *)((long)field + 0x10),output)
    ;
    for (index = 0; index < *field; index = index + 1) {
      pdVar2 = RepeatedField<double>::Get((RepeatedField<double> *)field,index);
      pdVar1 = (double *)output->ptr;
      *pdVar1 = *pdVar2;
      output->ptr = (uint8_t *)(pdVar1 + 1);
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}